

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listTags(Config *config)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestSpecParser *this;
  IRegistryHub *pIVar7;
  undefined4 extraout_var_02;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  iterator iVar8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  pointer pTVar11;
  size_t *psVar12;
  pointer pbVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar14;
  string tagName;
  string lcaseTagName;
  Text wrapper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  ostringstream oss;
  undefined1 local_2c8 [40];
  pointer local_2a0;
  string local_298;
  Text local_278;
  TestSpec local_228;
  pointer local_210;
  undefined1 local_208 [8];
  undefined1 auStack_200 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1d0;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_1c0;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  char local_198 [8];
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_168;
  _Base_ptr local_160;
  vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  vStack_158;
  undefined1 local_140 [8];
  pointer pFStack_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130 [16];
  
  iVar5 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_228.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar5));
  iVar5 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar5) == ((long *)CONCAT44(extraout_var_00,iVar5))[1]) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"All available tags:\n",0x14);
    pIVar7 = getRegistryHub();
    iVar5 = (*pIVar7->_vptr_IRegistryHub[4])(pIVar7);
    local_130[0]._8_8_ = CONCAT44(extraout_var_01,iVar5);
    local_190._8_8_ = (_Base_ptr)0x0;
    local_180._M_allocated_capacity._0_4_ = local_180._M_allocated_capacity._0_4_ & 0xffffff00;
    local_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    paStack_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_160 = (_Base_ptr)0x0;
    vStack_158.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_158.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_158.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_140 = (undefined1  [8])0x0;
    pFStack_138 = (pointer)0x0;
    local_130[0]._M_allocated_capacity = (pointer)0x0;
    paVar2 = &local_278.str.field_2;
    local_278.str._M_dataplus._M_p = (pointer)paVar2;
    local_190._0_8_ = &local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"*","");
    this = TestSpecParser::parse((TestSpecParser *)local_1a8,&local_278.str);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_2c8,&(this->m_testSpec).m_filters);
    auStack_200._8_8_ =
         local_228.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_200._0_8_ =
         local_228.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_208 = (undefined1  [8])
                local_228.m_filters.
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_228.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_2c8._16_8_;
    local_228.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_2c8._0_8_;
    local_228.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_2c8._8_8_;
    local_2c8._0_8_ = (pointer)0x0;
    local_2c8._8_8_ = (pointer)0x0;
    local_2c8._16_8_ = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_208);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.str._M_dataplus._M_p != paVar2) {
      operator_delete(local_278.str._M_dataplus._M_p);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_140);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector(&vStack_158);
    if (local_170 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_170);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._0_8_ != &local_180) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tags for matching test cases:\n",0x1e);
  }
  auStack_200._16_8_ = auStack_200;
  auStack_200._0_8_ = auStack_200._0_8_ & 0xffffffff00000000;
  auStack_200._8_8_ = (_Base_ptr)0x0;
  auStack_200._32_8_ = (pointer)0x0;
  auStack_200._24_8_ = auStack_200._16_8_;
  pIVar7 = getRegistryHub();
  iVar5 = (*pIVar7->_vptr_IRegistryHub[3])(pIVar7);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x18))
                        ((long *)CONCAT44(extraout_var_02,iVar5),config);
  filterTests(&local_1c0,testCases,&local_228,(IConfig *)config);
  local_210 = local_1c0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_1c0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1c0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_2a0 = local_1c0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      for (p_Var9 = ((local_1c0.
                      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                      super__Vector_impl_data._M_start)->super_TestCaseInfo).tags._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 !=
          &((local_1c0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
             .super__Vector_impl_data._M_start)->super_TestCaseInfo).tags._M_t._M_impl.
           super__Rb_tree_header; p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        local_2c8._0_8_ = (pointer)(local_2c8 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c8,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        toLower(&local_298,(string *)local_2c8);
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                        *)local_208,&local_298);
        if (iVar8._M_node == (_Base_ptr)auStack_200) {
          local_278.str._M_string_length._0_4_ = 0;
          local_278.str.field_2._M_allocated_capacity = 0;
          local_278.str.field_2._8_8_ = &local_278.str._M_string_length;
          local_278.attr.indent = 0;
          local_278.attr.width = 0;
          local_1a8 = (undefined1  [8])local_198;
          local_278.attr.initialIndent = local_278.str.field_2._8_8_;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,
                     CONCAT71(local_298._M_dataplus._M_p._1_7_,local_298._M_dataplus._M_p._0_1_),
                     local_298._M_string_length +
                     CONCAT71(local_298._M_dataplus._M_p._1_7_,local_298._M_dataplus._M_p._0_1_));
          if (local_278.str.field_2._M_allocated_capacity == 0) {
            local_180._8_8_ = 0;
            local_170 = &local_180;
            uVar6 = 0;
            psVar12 = (size_t *)&local_160;
            paStack_168 = local_170;
          }
          else {
            local_180._8_8_ = local_278.str.field_2._M_allocated_capacity;
            local_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_278.str.field_2._8_8_;
            paStack_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_278.attr.initialIndent;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(local_278.str.field_2._M_allocated_capacity + 8) = &local_180;
            local_160 = (_Base_ptr)local_278.attr.indent;
            local_278.str.field_2._M_allocated_capacity = 0;
            local_278.str.field_2._8_8_ = &local_278.str._M_string_length;
            psVar12 = &local_278.attr.indent;
            uVar6 = (uint)local_278.str._M_string_length;
            local_278.attr.initialIndent = local_278.str.field_2._8_8_;
          }
          *psVar12 = 0;
          vStack_158.
          super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_278.attr.width;
          local_180._M_allocated_capacity._0_4_ = uVar6;
          pVar14 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                   ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagInfo>>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                               *)local_208,
                              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                               *)local_1a8);
          iVar8._M_node = (_Base_ptr)pVar14.first._M_node;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_190 + 8));
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_278);
        }
        iVar8._M_node[3]._M_left = (_Base_ptr)((long)&(iVar8._M_node[3]._M_left)->_M_color + 1);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(iVar8._M_node + 2),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_298._M_dataplus._M_p._1_7_,local_298._M_dataplus._M_p._0_1_) !=
            &local_298.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_298._M_dataplus._M_p._1_7_,local_298._M_dataplus._M_p._0_1_
                                  ));
        }
        if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
          operator_delete((void *)local_2c8._0_8_);
        }
      }
      local_1c0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start = local_2a0 + 1;
    } while (local_1c0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
             .super__Vector_impl_data._M_start != local_210);
  }
  if ((pointer)auStack_200._16_8_ != (pointer)auStack_200) {
    pTVar11 = (pointer)auStack_200._16_8_;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      pcVar1 = local_198 + *(long *)((long)local_1a8 + -0x18);
      pcVar1[0] = '\x02';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
      TagInfo::all_abi_cxx11_
                ((string *)local_2c8,(TagInfo *)&(pTVar11->super_TestCaseInfo).description);
      aStack_1d0._8_8_ = 0x4f;
      auStack_200._40_8_ = 0;
      aStack_1d0._M_allocated_capacity = 0;
      std::__cxx11::stringbuf::str();
      aStack_1d0._M_allocated_capacity = local_298._M_string_length;
      aStack_1d0._8_8_ = 0x46;
      Tbc::Text::Text(&local_278,(string *)local_2c8,(TextAttributes *)(auStack_200 + 0x28));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_298._M_dataplus._M_p._1_7_,local_298._M_dataplus._M_p._0_1_) !=
          &local_298.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_298._M_dataplus._M_p._1_7_,local_298._M_dataplus._M_p._0_1_))
        ;
      }
      if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
        operator_delete((void *)local_2c8._0_8_);
      }
      local_2a0 = pTVar11;
      std::__cxx11::stringbuf::str();
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_2c8._0_8_,local_2c8._8_8_);
      pbVar3 = local_278.lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar13 = local_278.lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
          pbVar13 = pbVar13 + 1) {
        if (pbVar13 !=
            local_278.lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
      }
      local_298._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_298,1);
      if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
        operator_delete((void *)local_2c8._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_278.lines);
      pTVar11 = local_2a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278.str._M_dataplus._M_p != &local_278.str.field_2) {
        operator_delete(local_278.str._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)&pFStack_138);
      pTVar11 = (pointer)std::_Rb_tree_increment((_Rb_tree_node_base *)pTVar11);
    } while (pTVar11 != (pointer)auStack_200);
  }
  uVar4 = auStack_200._32_8_;
  paVar2 = &local_278.str.field_2;
  local_278.str._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"tag","");
  local_1a8 = (undefined1  [8])uVar4;
  local_1a0._M_p = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_278.str._M_dataplus._M_p,
             local_278.str._M_dataplus._M_p +
             CONCAT44(local_278.str._M_string_length._4_4_,(uint)local_278.str._M_string_length));
  operator<<((ostream *)&std::cout,(pluralise *)local_1a8);
  local_2c8[0] = 10;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_2c8,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (local_1a0._M_p != local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.str._M_dataplus._M_p != paVar2) {
    operator_delete(local_278.str._M_dataplus._M_p);
  }
  uVar4 = auStack_200._32_8_;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_1c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
               *)local_208);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_228.m_filters);
  return (size_t)(pointer)uVar4;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << '\n';
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << '\n' << std::endl;
        return tagCounts.size();
    }